

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__unnormalized
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  unnormalized__AttributeData *puVar1;
  char **ppcVar2;
  size_t in_RDX;
  StackMemoryManager *in_RSI;
  ParserChar *attributeValue;
  ParserChar *attribute;
  ParserChar **attributeArray;
  unnormalized__AttributeData *attributeData;
  void **in_stack_ffffffffffffffb8;
  StackFrame *pSVar3;
  ParserTemplateBase *in_stack_ffffffffffffffc0;
  char *objectSize;
  StackMemoryManager *this_00;
  
  puVar1 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::unnormalized__AttributeData>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (StackMemoryManager *)in_RSI->mActiveFrame;
  if (this_00 != (StackMemoryManager *)0x0) {
    while (objectSize = (char *)this_00->mActiveFrame, objectSize != (char *)0x0) {
      if (&this_00->mFrames == (StackFrame **)0x0) {
        return false;
      }
      pSVar3 = this_00->mFrames;
      this_00 = this_00 + 1;
      if ((puVar1->unknownAttributes).data == (char **)0x0) {
        ppcVar2 = (char **)GeneratedSaxParser::StackMemoryManager::newObject
                                     (this_00,(size_t)objectSize);
        (puVar1->unknownAttributes).data = ppcVar2;
      }
      else {
        ppcVar2 = (char **)GeneratedSaxParser::StackMemoryManager::growObject(in_RSI,in_RDX);
        (puVar1->unknownAttributes).data = ppcVar2;
      }
      (puVar1->unknownAttributes).data[(puVar1->unknownAttributes).size] = objectSize;
      (puVar1->unknownAttributes).data[(puVar1->unknownAttributes).size + 1] = (char *)pSVar3;
      (puVar1->unknownAttributes).size = (puVar1->unknownAttributes).size + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__unnormalized( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__unnormalized( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

unnormalized__AttributeData* attributeData = newData<unnormalized__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
}


    return true;
}